

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

ucs4_t * utf8_to_ucs4(char *utf8,size_t length)

{
  size_t sVar1;
  long lVar2;
  ucs4_t *puVar3;
  bool bVar4;
  uint local_58;
  uint local_54;
  ucs4_t byte [4];
  ucs4_t *local_40;
  ucs4_t *pucs4;
  ucs4_t *ucs4;
  size_t freesize;
  size_t i;
  size_t length_local;
  char *utf8_local;
  
  i = length;
  if (length == 0) {
    i = 0xffffffffffffffff;
  }
  freesize = 0;
  while( true ) {
    sVar1 = freesize;
    bVar4 = false;
    if (freesize < i) {
      bVar4 = utf8[freesize] != '\0';
    }
    if (!bVar4) break;
    freesize = freesize + 1;
  }
  ucs4 = (ucs4_t *)0x400;
  local_40 = (ucs4_t *)malloc(0x1000);
  freesize = 0;
  pucs4 = local_40;
  do {
    if (sVar1 <= freesize) {
      lVar2 = (long)local_40 - (long)pucs4 >> 2;
      puVar3 = (ucs4_t *)realloc(pucs4,(lVar2 + 1) * 4);
      puVar3[lVar2] = 0;
      return puVar3;
    }
    memset(&local_58,0,0x10);
    if ((utf8[freesize] >> 7 & 1U) == 0) {
      local_58 = (int)utf8[freesize] & 0x7f;
    }
    else if ((utf8[freesize] >> 5 & 1U) == 0) {
      if (sVar1 <= freesize + 1) goto LAB_001066c7;
      local_58 = ((int)utf8[freesize + 1] & 0x3fU) + ((int)utf8[freesize] & 3U) * 0x40;
      local_54 = (int)utf8[freesize] >> 2 & 7;
      freesize = freesize + 1;
    }
    else if ((utf8[freesize] >> 4 & 1U) == 0) {
      if (sVar1 <= freesize + 2) goto LAB_001066c7;
      local_58 = ((int)utf8[freesize + 2] & 0x3fU) + ((int)utf8[freesize + 1] & 3U) * 0x40;
      local_54 = ((int)utf8[freesize + 1] >> 2 & 0xfU) + ((int)utf8[freesize] & 0xfU) * 0x10;
      freesize = freesize + 2;
    }
    else if ((utf8[freesize] >> 3 & 1U) == 0) {
      if (sVar1 <= freesize + 3) goto LAB_001066c7;
      local_58 = ((int)utf8[freesize + 3] & 0x3fU) + ((int)utf8[freesize + 2] & 3U) * 0x40;
      local_54 = ((int)utf8[freesize + 2] >> 2 & 0xfU) + ((int)utf8[freesize + 1] & 0xfU) * 0x10;
      byte[0] = ((int)utf8[freesize + 1] >> 4 & 3U) + ((int)utf8[freesize] & 7U) * 4;
      freesize = freesize + 3;
    }
    else if ((utf8[freesize] >> 2 & 1U) == 0) {
      if (sVar1 <= freesize + 4) {
LAB_001066c7:
        free(pucs4);
        return (ucs4_t *)0xffffffffffffffff;
      }
      local_58 = ((int)utf8[freesize + 4] & 0x3fU) + ((int)utf8[freesize + 3] & 3U) * 0x40;
      local_54 = ((int)utf8[freesize + 3] >> 2 & 0xfU) + ((int)utf8[freesize + 2] & 0xfU) * 0x10;
      byte[0] = ((int)utf8[freesize + 2] >> 4 & 3U) + ((int)utf8[freesize + 1] & 0x3fU) * 4;
      byte[1] = (int)utf8[freesize] & 3;
      freesize = freesize + 4;
    }
    else {
      if (((utf8[freesize] >> 2 & 1U) != 0) || (sVar1 <= freesize + 5)) goto LAB_001066c7;
      local_58 = ((int)utf8[freesize + 5] & 0x3fU) + ((int)utf8[freesize + 4] & 3U) * 0x40;
      local_54 = ((int)utf8[freesize + 4] >> 2 & 0xfU) + ((int)utf8[freesize + 3] & 0xfU) * 0x10;
      byte[0] = ((int)utf8[freesize + 3] >> 4 & 3U) + ((int)utf8[freesize + 2] & 0x3fU) * 4;
      byte[1] = ((int)utf8[freesize + 1] & 0x3fU) + ((int)utf8[freesize] & 1U) * 0x40;
      freesize = freesize + 5;
    }
    if (ucs4 == (ucs4_t *)0x0) {
      ucs4 = (ucs4_t *)((long)local_40 - (long)pucs4 >> 2);
      pucs4 = (ucs4_t *)realloc(pucs4,(long)ucs4 << 3);
      local_40 = pucs4 + (long)ucs4;
    }
    *local_40 = byte[1] * 0x1000000 + byte[0] * 0x10000 + local_54 * 0x100 + local_58;
    local_40 = local_40 + 1;
    ucs4 = (ucs4_t *)((long)ucs4 + -1);
    freesize = freesize + 1;
  } while( true );
}

Assistant:

ucs4_t * utf8_to_ucs4(const char * utf8, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && utf8[i] != '\0'; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	ucs4_t * ucs4 = (ucs4_t *) malloc(sizeof(ucs4_t) * freesize);
	ucs4_t * pucs4 = ucs4;

	for (i = 0; i < length; i ++)
	{
		ucs4_t byte[4] = {0};
		if (GET_BIT(utf8[i], 7) == 0)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			byte[0] = utf8[i] & BITMASK(7);
		}
		else if (GET_BIT(utf8[i], 5) == 0)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			if (i + 1 >= length)
				goto err;

			byte[0] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(2)) << 6);
			byte[1] = (utf8[i] >> 2) & BITMASK(3);

			i += 1;
		}
		else if (GET_BIT(utf8[i], 4) == 0)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			if (i + 2 >= length)
				goto err;

			byte[0] = (utf8[i + 2] & BITMASK(6)) +
					((utf8[i + 1] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 1] >> 2) & BITMASK(4))
					+ ((utf8[i] & BITMASK(4)) << 4);

			i += 2;
		}
		else if (GET_BIT(utf8[i], 3) == 0)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 3 >= length)
				goto err;

			byte[0] = (utf8[i + 3] & BITMASK(6)) +
					((utf8[i + 2] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 2] >> 2) & BITMASK(4)) +
					((utf8[i + 1] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 1] >> 4) & BITMASK(2)) +
					((utf8[i] & BITMASK(3)) << 2);

			i += 3;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 4 >= length)
				goto err;

			byte[0] = (utf8[i + 4] & BITMASK(6)) +
					((utf8[i + 3] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 3] >> 2) & BITMASK(4)) +
					((utf8[i + 2] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 2] >> 4) & BITMASK(2)) +
					((utf8[i + 1] & BITMASK(6)) << 2);
			byte[3] = utf8[i] & BITMASK(2);
			i += 4;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 5 >= length)
				goto err;

			byte[0] = (utf8[i + 5] & BITMASK(6)) +
					((utf8[i + 4] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 4] >> 2) & BITMASK(4)) +
					((utf8[i + 3] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 3] >> 4) & BITMASK(2)) +
					((utf8[i + 2] & BITMASK(6)) << 2);
			byte[3] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(1)) << 6);
			i += 5;
		}
		else
			goto err;

		if (freesize == 0)
		{
			freesize = pucs4 - ucs4;
			ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * (freesize + freesize));
			pucs4 = ucs4 + freesize;
		}

		*pucs4 = (byte[3] << 24) + (byte[2] << 16) + (byte[1] << 8) + byte[0];

		pucs4 ++;
		freesize --;
	}

	length = (pucs4 - ucs4 + 1);
	ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * length);
	ucs4[length - 1] = 0;
	return ucs4;

err:
	free(ucs4);
	return (ucs4_t *) -1;
}